

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_array.cc
# Opt level: O2

void __thiscall ArrayType::~ArrayType(ArrayType *this)

{
  (this->super_Type).super_DataDepElement._vptr_DataDepElement =
       (_func_int **)&PTR__ArrayType_00140000;
  if (this->arraylength_var_field_ != (Field *)0x0) {
    (*(this->arraylength_var_field_->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->elem_it_var_field_ != (Field *)0x0) {
    (*(this->elem_it_var_field_->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->elem_var_field_ != (Field *)0x0) {
    (*(this->elem_var_field_->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->elem_dataptr_var_field_ != (Field *)0x0) {
    (*(this->elem_dataptr_var_field_->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->elem_input_var_field_ != (Field *)0x0) {
    (*(this->elem_input_var_field_->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->elem_dataptr_until_expr_ != (Expr *)0x0) {
    (*(this->elem_dataptr_until_expr_->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  std::__cxx11::string::~string((string *)&this->end_of_array_loop_label_);
  std::__cxx11::string::~string((string *)&this->datatype_str_);
  std::__cxx11::string::~string((string *)&this->vector_str_);
  Type::~Type(&this->super_Type);
  return;
}

Assistant:

ArrayType::~ArrayType()
	{
	delete arraylength_var_field_;
	delete elem_it_var_field_;
	delete elem_var_field_;
	delete elem_dataptr_var_field_;
	delete elem_input_var_field_;

	delete elem_dataptr_until_expr_;
	}